

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O3

int fffr8r4(double *input,long ntodo,double scale,double zero,int nullcheck,float nullval,
           char *nullarray,int *anynull,float *output,int *status)

{
  ushort uVar1;
  char cVar2;
  long lVar3;
  float fVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          dVar5 = input[lVar3] * scale + zero;
          if (-3.4028234663852886e+38 <= dVar5) {
            if (dVar5 <= 3.4028234663852886e+38) {
              fVar4 = (float)dVar5;
            }
            else {
              *status = -0xb;
              fVar4 = 3.4028235e+38;
            }
          }
          else {
            *status = -0xb;
            fVar4 = -3.4028235e+38;
          }
          output[lVar3] = fVar4;
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
    }
    else if (0 < ntodo) {
      lVar3 = 0;
      do {
        dVar5 = input[lVar3];
        if (-3.4028234663852886e+38 <= dVar5) {
          if (dVar5 <= 3.4028234663852886e+38) {
            fVar4 = (float)dVar5;
          }
          else {
            *status = -0xb;
            fVar4 = 3.4028235e+38;
          }
        }
        else {
          *status = -0xb;
          fVar4 = -3.4028235e+38;
        }
        output[lVar3] = fVar4;
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar3 = 0;
      do {
        uVar1 = *(ushort *)((long)input + lVar3 * 8 + 6);
        cVar2 = ((uVar1 & 0x7ff0) == 0) * '\x02';
        if ((uVar1 & 0x7ff0) == 0x7ff0) {
          cVar2 = '\x01';
        }
        if (cVar2 == '\0') {
          dVar5 = input[lVar3] * scale + zero;
          if (dVar5 < -3.4028234663852886e+38) {
LAB_00192237:
            *status = -0xb;
            output[lVar3] = -3.4028235e+38;
          }
          else if (3.4028234663852886e+38 < dVar5) {
LAB_00192254:
            *status = -0xb;
            output[lVar3] = 3.4028235e+38;
          }
          else {
            output[lVar3] = (float)dVar5;
          }
        }
        else if (cVar2 == '\x01') {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else {
          if (zero < -3.4028234663852886e+38) goto LAB_00192237;
          if (3.4028234663852886e+38 < zero) goto LAB_00192254;
          output[lVar3] = (float)zero;
        }
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (0 < ntodo) {
    lVar3 = 0;
    do {
      uVar1 = *(ushort *)((long)input + lVar3 * 8 + 6);
      cVar2 = ((uVar1 & 0x7ff0) == 0) * '\x02';
      if ((uVar1 & 0x7ff0) == 0x7ff0) {
        cVar2 = '\x01';
      }
      if (cVar2 == '\0') {
        dVar5 = input[lVar3];
        if (-3.4028234663852886e+38 <= dVar5) {
          if (dVar5 <= 3.4028234663852886e+38) {
            output[lVar3] = (float)dVar5;
          }
          else {
            *status = -0xb;
            output[lVar3] = 3.4028235e+38;
          }
        }
        else {
          *status = -0xb;
          output[lVar3] = -3.4028235e+38;
        }
      }
      else if (cVar2 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar3] = nullval;
        }
        else {
          nullarray[lVar3] = '\x01';
        }
      }
      else {
        output[lVar3] = 0.0;
      }
      lVar3 = lVar3 + 1;
    } while (ntodo != lVar3);
  }
  return *status;
}

Assistant:

int fffr8r4(double *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            float nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            float *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    short *sptr, iret;
    double dvalue=0;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
                if (input[ii] < -FLT_MAX)
                {
                   *status = OVERFLOW_ERR;
                   output[ii] = -FLT_MAX;
                }
                else if (input[ii] > FLT_MAX)
                {
                   *status = OVERFLOW_ERR;
                   output[ii] = FLT_MAX;
                }
                else
                   output[ii] = (float) input[ii]; /* copy input to output */
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;
                if (dvalue < -FLT_MAX)
                {
                   *status = OVERFLOW_ERR;
                   output[ii] = -FLT_MAX;
                }
                else if (dvalue > FLT_MAX)
                {
                   *status = OVERFLOW_ERR;
                   output[ii] = FLT_MAX;
                }
                else
                   output[ii] = (float) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr += 3;       /* point to MSBs */
#endif
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
              {
                 if (input[ii] < -FLT_MAX)
                 {
                    *status = OVERFLOW_ERR;
                    output[ii] = -FLT_MAX;
                 }
                 else if (input[ii] > FLT_MAX)
                 {
                    *status = OVERFLOW_ERR;
                    output[ii] = FLT_MAX;
                 }
                 else
                    output[ii] = (float) input[ii];
               }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  {
                     if (zero < -FLT_MAX)
                     {
                        *status = OVERFLOW_ERR;
                        output[ii] = -FLT_MAX;
                     }
                     else if (zero > FLT_MAX)
                     {
                        *status = OVERFLOW_ERR;
                        output[ii] = FLT_MAX;
                     }
                     else
                        output[ii] = (float) zero;
                   }
              }
              else
              {
                  dvalue = input[ii] * scale + zero;
                  if (dvalue < -FLT_MAX)
                  {
                     *status = OVERFLOW_ERR;
                     output[ii] = -FLT_MAX;
                  }
                  else if (dvalue > FLT_MAX)
                  {
                     *status = OVERFLOW_ERR;
                     output[ii] = FLT_MAX;
                  }
                  else
                     output[ii] = (float) dvalue;
              }
            }
        }
    }
    return(*status);
}